

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O2

int xmlParserInputBufferCreateUrl
              (char *URI,xmlCharEncoding enc,int flags,xmlParserInputBufferPtr *out)

{
  code *pcVar1;
  xmlInputCloseCallback p_Var2;
  int __fd;
  int iVar3;
  xmlParserInputBufferPtr buf;
  void *pvVar4;
  int flags_00;
  int *piVar5;
  ulong uVar6;
  int fd;
  
  xmlInitParser();
  *out = (xmlParserInputBufferPtr)0x0;
  if (URI == (char *)0x0) {
    iVar3 = 0x73;
  }
  else {
    buf = xmlAllocParserInputBuffer(enc);
    if (buf == (xmlParserInputBufferPtr)0x0) {
      iVar3 = 2;
    }
    else {
      uVar6 = (ulong)(uint)xmlInputCallbackNr;
      piVar5 = &xmlInputCallbackNr + uVar6 * 8;
      for (; 0 < (int)uVar6; uVar6 = (ulong)((int)uVar6 - 1)) {
        pcVar1 = *(code **)(piVar5 + -4);
        if (pcVar1 == xmlIODefaultMatch) {
          iVar3 = xmlFdOpen(URI,0,&fd);
          __fd = fd;
          if (iVar3 == 0) {
            iVar3 = xmlInputFromFd(buf,fd,flags_00);
            close(__fd);
          }
          if (iVar3 != 0x5f4) {
            if (iVar3 == 0) goto LAB_00159d3b;
            goto LAB_00159d1a;
          }
        }
        else if ((pcVar1 != (code *)0x0) && (iVar3 = (*pcVar1)(URI), iVar3 != 0)) {
          pvVar4 = (void *)(**(code **)(piVar5 + -2))(URI);
          buf->context = pvVar4;
          if (pvVar4 != (void *)0x0) {
            p_Var2 = *(xmlInputCloseCallback *)(piVar5 + 2);
            buf->readcallback = *(xmlInputReadCallback *)piVar5;
            buf->closecallback = p_Var2;
            iVar3 = 0;
            goto LAB_00159d3b;
          }
        }
        piVar5 = piVar5 + -8;
      }
      iVar3 = 0x5f4;
LAB_00159d1a:
      xmlFreeParserInputBuffer(buf);
      buf = (xmlParserInputBufferPtr)0x0;
LAB_00159d3b:
      *out = buf;
    }
  }
  return iVar3;
}

Assistant:

int
xmlParserInputBufferCreateUrl(const char *URI, xmlCharEncoding enc,
                              int flags, xmlParserInputBufferPtr *out) {
    xmlParserInputBufferPtr buf;
    int ret;
    int i;

    xmlInitParser();

    *out = NULL;
    if (URI == NULL)
        return(XML_ERR_ARGUMENT);

    /*
     * Allocate the Input buffer front-end.
     */
    buf = xmlAllocParserInputBuffer(enc);
    if (buf == NULL)
        return(XML_ERR_NO_MEMORY);

    /*
     * Try to find one of the input accept method accepting that scheme
     * Go in reverse to give precedence to user defined handlers.
     */
    ret = XML_IO_ENOENT;
    for (i = xmlInputCallbackNr - 1; i >= 0; i--) {
        xmlInputCallback *cb = &xmlInputCallbackTable[i];

        if (cb->matchcallback == xmlIODefaultMatch) {
            ret = xmlInputDefaultOpen(buf, URI, flags);

            if ((ret == XML_ERR_OK) || (ret != XML_IO_ENOENT))
                break;
        } else if ((cb->matchcallback != NULL) &&
                   (cb->matchcallback(URI) != 0)) {
            buf->context = cb->opencallback(URI);
            if (buf->context != NULL) {
                buf->readcallback = cb->readcallback;
                buf->closecallback = cb->closecallback;
                ret = XML_ERR_OK;
                break;
            }
        }
    }
    if (ret != XML_ERR_OK) {
        xmlFreeParserInputBuffer(buf);
        *out = NULL;
	return(ret);
    }

    *out = buf;
    return(ret);
}